

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O3

int igsc_ecc_config_get(igsc_device_handle *handle,uint8_t *cur_ecc_state,uint8_t *pen_ecc_state)

{
  igsc_lib_ctx *lib_ctx;
  mkhi_msg_hdr *resp_header;
  uint uVar1;
  int iVar2;
  int iVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  char *pcVar6;
  igsc_log_level_type iVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  size_t received_len;
  char __time_buf [128];
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar10;
  size_t sVar9;
  size_t local_c0;
  char local_b8 [128];
  long local_38;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 0;
  iVar2 = 3;
  if ((((handle == (igsc_device_handle *)0x0) || (pen_ecc_state == (uint8_t *)0x0)) ||
      (cur_ecc_state == (uint8_t *)0x0)) || (lib_ctx = handle->ctx, lib_ctx == (igsc_lib_ctx *)0x0))
  goto LAB_00115585;
  uVar1 = igsc_get_log_level();
  if (uVar1 != 0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) in get ecc config, initializing driver\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ecc_config_get",0x627);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,
                "%s: IGSC: (%s:%s():%d) in get ecc config, initializing driver\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ecc_config_get",0x627);
    }
  }
  iVar2 = gsc_driver_init(lib_ctx,&GUID_METEE_MKHI);
  if (iVar2 != 0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ecc_config_get",0x62c,CONCAT44(uVar10,iVar2));
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",
                pcVar5,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ecc_config_get",0x62c,CONCAT44(uVar10,iVar2));
    }
    goto LAB_00115585;
  }
  resp_header = (mkhi_msg_hdr *)lib_ctx->working_buffer;
  sVar9 = lib_ctx->working_buffer_length;
  uVar1 = igsc_get_log_level();
  if (uVar1 != 0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ecc_config_get",0x637);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ecc_config_get",0x637);
    }
  }
  iVar3 = gsc_fwu_buffer_validate(lib_ctx,8,0xc);
  if (iVar3 == 0) {
    *(undefined8 *)resp_header = 0x900000031;
    uVar1 = igsc_get_log_level();
    if (uVar1 != 0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        syslog(7,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ecc_config_get",0x645);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ecc_config_get",0x645);
      }
    }
    iVar3 = gsc_tee_command(lib_ctx,resp_header,8,resp_header,sVar9,&local_c0);
    if (iVar3 != 0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
        iVar2 = 3;
        uVar8 = 0x64a;
        goto LAB_001154be;
      }
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
      iVar7 = IGSC_LOG_LEVEL_ERROR;
      uVar8 = 0x64a;
      goto LAB_0011541b;
    }
    if (local_c0 < 4) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
        uVar8 = 0x650;
        sVar9 = local_c0;
        goto LAB_00115571;
      }
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
      uVar8 = 0x650;
      sVar9 = local_c0;
      goto LAB_0011547f;
    }
    iVar3 = gfsp_heci_validate_response_header(lib_ctx,resp_header,(uint32_t)resp_header[1],9);
    if (iVar3 != 0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
        iVar2 = 3;
        uVar8 = 0x65a;
        goto LAB_001154be;
      }
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
      iVar7 = IGSC_LOG_LEVEL_ERROR;
      uVar8 = 0x65a;
      goto LAB_0011541b;
    }
    if (resp_header->result == '\0') {
      if (0xb < local_c0) {
        *cur_ecc_state = resp_header[2].group_id;
        *pen_ecc_state = resp_header[2].field_0x1;
        uVar1 = igsc_get_log_level();
        iVar2 = 0;
        iVar3 = 0;
        if (uVar1 != 0) {
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(local_b8,0x80);
            pcVar6 = "%s: IGSC: (%s:%s():%d) Get ECC config success\n";
            iVar2 = 7;
            uVar8 = 0x670;
            goto LAB_001154be;
          }
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(local_b8,0x80);
          pcVar6 = "%s: IGSC: (%s:%s():%d) Get ECC config success\n";
          iVar7 = IGSC_LOG_LEVEL_DEBUG;
          uVar8 = 0x670;
          goto LAB_0011541b;
        }
        goto LAB_0011557d;
      }
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
        uVar8 = 0x668;
        sVar9 = local_c0;
        goto LAB_00115571;
      }
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
      uVar8 = 0x668;
      sVar9 = local_c0;
LAB_0011547f:
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,pcVar6,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ecc_config_get",uVar8,sVar9);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 != (igsc_log_func_t)0x0) {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Get ECC config command failed with result 0x%x\n";
        uVar8 = 0x661;
        sVar9 = CONCAT44(uVar10,(uint)resp_header->result);
        goto LAB_0011547f;
      }
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Get ECC config command failed with result 0x%x\n";
      uVar8 = 0x661;
      sVar9 = CONCAT44(uVar10,(uint)resp_header->result);
LAB_00115571:
      syslog(3,pcVar6,pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ecc_config_get",uVar8,sVar9);
    }
    iVar2 = 6;
  }
  else {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n";
      iVar2 = 3;
      uVar8 = 0x63c;
LAB_001154be:
      syslog(iVar2,pcVar6,pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ecc_config_get",uVar8);
      iVar2 = iVar3;
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n";
      iVar7 = IGSC_LOG_LEVEL_ERROR;
      uVar8 = 0x63c;
LAB_0011541b:
      (*p_Var4)(iVar7,pcVar6,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ecc_config_get",uVar8);
      iVar2 = iVar3;
    }
  }
LAB_0011557d:
  gsc_driver_deinit(lib_ctx);
LAB_00115585:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int igsc_ecc_config_get(IN  struct igsc_device_handle *handle,
                        OUT uint8_t *cur_ecc_state,
                        OUT uint8_t *pen_ecc_state)
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx *lib_ctx;
    struct gfsp_get_ecc_config_req *req;
    struct gfsp_get_ecc_config_res *resp;

    if (!handle || !handle->ctx || !cur_ecc_state || !pen_ecc_state)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    gsc_debug("in get ecc config, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_MKHI);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct gfsp_get_ecc_config_req *)lib_ctx->working_buffer;
    request_len = sizeof(*req);

    resp = (struct gfsp_get_ecc_config_res *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);
    buf_len = lib_ctx->working_buffer_length;

    gsc_debug("validating buffer\n");

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Internal error - failed to validate buffer %d\n", status);
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.group_id = MKHI_GROUP_ID_GFSP;
    req->header.command = 0;
    req->gfsp_heci_header = GFSP_GET_ECC_CFG_CMD;

    gsc_debug("sending command\n");

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (received_len < sizeof(resp->header))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    status = gfsp_heci_validate_response_header(lib_ctx, &resp->header,
                                                resp->gfsp_heci_header,
                                                GFSP_GET_ECC_CFG_CMD);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (resp->header.result != 0)
    {
       gsc_error("Get ECC config command failed with result 0x%x\n",
                 resp->header.result);
       status = IGSC_ERROR_PROTOCOL;
       goto exit;
    }

    if (received_len < response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    *cur_ecc_state = resp->cur_ecc_state;
    *pen_ecc_state = resp->pen_ecc_state;

    gsc_debug("Get ECC config success\n");

exit:
    gsc_driver_deinit(lib_ctx);

    return status;
}